

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

Scalar cnn::logdet<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                 (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *M,
                 bool use_cholesky)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  long lVar4;
  Index IVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar13 [12];
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> lu;
  float local_7c;
  undefined1 local_78 [16];
  LLT<Eigen::Matrix<float,_1,_1,0,_1,_1>,1> *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  long local_38;
  char local_23;
  
  auVar13 = in_ZMM0._4_12_;
  if ((int)CONCAT71(in_register_00000031,use_cholesky) == 0) {
    Eigen::PartialPivLU<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              ((PartialPivLU<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_60,
               (EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)M);
    if (local_23 == '\0') {
      __assert_fail("m_isInitialized && \"PartialPivLU is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/LU/PartialPivLU.h",0x91,
                    "const MatrixType &Eigen::PartialPivLU<Eigen::Matrix<float, -1, -1>>::matrixLU() const [MatrixType = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    IVar5 = Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::determinant
                      ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)&local_48);
    lVar4 = local_60;
    local_78._0_4_ = (undefined4)IVar5;
    local_78._4_12_ = auVar13;
    if ((long)local_58 < 1) {
      local_7c = 0.0;
    }
    else {
      local_7c = 0.0;
      uVar6 = 0;
      uVar8 = 1;
      do {
        if (local_50 <= (long)uVar6) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<float, -1, -1>, Level = 0]"
                       );
        }
        auVar9._8_4_ = 0x80000000;
        auVar9._0_8_ = 0x8000000080000000;
        auVar9._12_4_ = 0x80000000;
        auVar9 = vxorps_avx512vl(local_78,auVar9);
        auVar12 = ZEXT416(*(uint *)(lVar4 + local_58 * uVar6 * 4 + uVar6 * 4));
        uVar1 = vcmpss_avx512f(auVar12,ZEXT416(0),1);
        bVar2 = (bool)((byte)uVar1 & 1);
        local_78._0_4_ = (uint)bVar2 * auVar9._0_4_ + (uint)!bVar2 * local_78._0_4_;
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        auVar9 = vandps_avx512vl(auVar12,auVar3);
        fVar11 = logf(auVar9._0_4_);
        local_7c = fVar11 + local_7c;
        bVar2 = uVar8 < local_58;
        uVar6 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar2);
    }
    fVar11 = logf((float)local_78._0_4_);
    if (local_38 != 0) {
      free(*(void **)(local_38 + -8));
    }
    if (CONCAT44(uStack_44,local_48) != 0) {
      free(*(void **)(CONCAT44(uStack_44,local_48) + -8));
    }
    if (local_60 != 0) {
      free(*(void **)(local_60 + -8));
    }
    fVar11 = fVar11 + local_7c;
  }
  else {
    Eigen::LLT<Eigen::Matrix<float,-1,-1,0,-1,-1>,1>::
    LLT<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              ((LLT<Eigen::Matrix<float,_1,_1,0,_1,_1>,1> *)&local_60,
               (EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)M);
    if ((char)uStack_44 == '\0') {
      __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/Cholesky/LLT.h",0x89,
                    "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<float, -1, -1>>::matrixL() const [MatrixType = Eigen::Matrix<float, -1, -1>, UpLo = 1]"
                   );
    }
    local_68 = (LLT<Eigen::Matrix<float,_1,_1,0,_1,_1>,1> *)&local_60;
    if ((M->
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        ).
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < 1) {
      fVar11 = 0.0;
    }
    else {
      fVar11 = 0.0;
      uVar7 = 1;
      uVar6 = 0;
      do {
        Eigen::
        TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1U>_>::
        check_coordinates((TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1U>_>
                           *)&local_68,uVar6,uVar6);
        fVar10 = logf(*(float *)(*(long *)(local_68 + 8) * uVar6 * 4 + *(long *)local_68 + uVar6 * 4
                                ));
        uVar6 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        fVar11 = fVar10 + fVar11;
      } while ((long)uVar6 <
               (M->
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ).
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value);
      fVar11 = fVar11 + fVar11;
    }
    if (local_60 != 0) {
      free(*(void **)(local_60 + -8));
    }
  }
  return fVar11;
}

Assistant:

inline typename MatrixType::Scalar logdet(const MatrixType& M, bool use_cholesky = false) {
  using namespace Eigen;
  using std::log;
  typedef typename MatrixType::Scalar Scalar;
  Scalar ld = 0;
  if (use_cholesky) {
    LLT<Matrix<Scalar,Dynamic,Dynamic>> chol(M);
    auto& U = chol.matrixL();
    for (unsigned i = 0; i < M.rows(); ++i)
      ld += log(U(i,i));
    ld *= 2;
  } else {
    PartialPivLU<Matrix<Scalar,Dynamic,Dynamic>> lu(M);
    auto& LU = lu.matrixLU();
    Scalar c = lu.permutationP().determinant(); // -1 or 1
    for (unsigned i = 0; i < LU.rows(); ++i) {
      const auto& lii = LU(i,i);
      if (lii < Scalar(0)) c *= -1;
      ld += log(abs(lii));
    }
    ld += log(c);
  }
  return ld;
}